

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O0

int send_buffer(socket_server *ss,socket *s,socket_message *result)

{
  int iVar1;
  socket_message *result_local;
  socket *s_local;
  socket_server *ss_local;
  
  iVar1 = list_uncomplete(&s->low);
  if (iVar1 != 0) {
    __assert_fail("!list_uncomplete(&s->low)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/skynet-src/socket_server.c"
                  ,0x259,
                  "int send_buffer(struct socket_server *, struct socket *, struct socket_message *)"
                 );
  }
  iVar1 = send_list(ss,s,&s->high,result);
  if (iVar1 != 1) {
    if ((s->high).head == (write_buffer *)0x0) {
      if ((s->low).head == (write_buffer *)0x0) {
        sp_write(ss->event_fd,s->fd,s,false);
        if (s->type == 6) {
          force_close(ss,s,result);
          return 1;
        }
      }
      else {
        iVar1 = send_list(ss,s,&s->low,result);
        if (iVar1 == 1) {
          return 1;
        }
        iVar1 = list_uncomplete(&s->low);
        if (iVar1 != 0) {
          raise_uncomplete(s);
        }
      }
    }
    return -1;
  }
  return 1;
}

Assistant:

static int
send_buffer(struct socket_server *ss, struct socket *s, struct socket_message *result) {
	assert(!list_uncomplete(&s->low));
	// step 1
	if (send_list(ss,s,&s->high,result) == SOCKET_CLOSE) {
		return SOCKET_CLOSE;
	}
	if (s->high.head == NULL) {
		// step 2
		if (s->low.head != NULL) {
			if (send_list(ss,s,&s->low,result) == SOCKET_CLOSE) {
				return SOCKET_CLOSE;
			}
			// step 3
			if (list_uncomplete(&s->low)) {
				raise_uncomplete(s);
			}
		} else {
			// step 4
			sp_write(ss->event_fd, s->fd, s, false);

			if (s->type == SOCKET_TYPE_HALFCLOSE) {
				force_close(ss, s, result);
				return SOCKET_CLOSE;
			}
		}
	}

	return -1;
}